

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Array<kj::String> * __thiscall
kj::anon_unknown_9::DiskHandle::listNames
          (Array<kj::String> *__return_storage_ptr__,DiskHandle *this)

{
  Array<kj::String> *pAVar1;
  bool bVar2;
  int iVar3;
  int osErrorNumber;
  __off64_t _Var4;
  DIR *__dirp;
  int *piVar5;
  dirent64 *pdVar6;
  size_t sVar7;
  ArrayBuilder<kj::String> *pAVar8;
  StringPtr value;
  StringPtr value_00;
  StringPtr name;
  Vector<kj::String> entries;
  DIR *dir;
  Fault f_3;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_filesystem_disk_unix_c__:687:5)>
  _kjDefer687;
  ArrayPtr<const_char> local_b8;
  ArrayBuilder<kj::String> local_a8;
  DIR *local_88;
  Array<char> local_80;
  Array<kj::String> *local_68;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_filesystem_disk_unix_c__:687:5)>
  local_60;
  StringPtr local_50;
  ArrayPtr<const_char> local_40;
  
  do {
    _Var4 = lseek64((this->fd).fd,0,0);
    if (-1 < _Var4) goto LAB_003be04d;
    iVar3 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x2a3,iVar3,"lseek(fd, 0, SEEK_SET)","");
    kj::_::Debug::Fault::fatal((Fault *)&local_a8);
  }
LAB_003be04d:
  do {
    iVar3 = dup((this->fd).fd);
    if (-1 < iVar3) goto LAB_003be06e;
    osErrorNumber = kj::_::Debug::getOsErrorNumber(false);
  } while (osErrorNumber == -1);
  if (osErrorNumber != 0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x2a8,osErrorNumber,"duped = dup(fd)","");
    kj::_::Debug::Fault::fatal((Fault *)&local_a8);
  }
LAB_003be06e:
  local_68 = __return_storage_ptr__;
  __dirp = fdopendir(iVar3);
  local_88 = __dirp;
  if (__dirp == (DIR *)0x0) {
    close(iVar3);
    piVar5 = __errno_location();
    kj::_::Debug::Fault::Fault
              ((Fault *)&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x2ac,*piVar5,"fdopendir","");
    kj::_::Debug::Fault::fatal((Fault *)&local_a8);
  }
  local_60.maybeFunc.ptr.isSet = true;
  local_60.maybeFunc.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_filesystem_disk_unix_c__:687:5)>_2
        )&local_88;
  pAVar8 = &local_a8;
  local_a8.endPtr = (String *)0x0;
  local_a8.ptr = (String *)0x0;
  local_a8.pos = (RemoveConst<kj::String> *)0x0;
  local_a8.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  piVar5 = __errno_location();
  while( true ) {
    *piVar5 = 0;
    pdVar6 = readdir64(__dirp);
    pAVar1 = local_68;
    if (pdVar6 == (dirent64 *)0x0) break;
    sVar7 = strlen(pdVar6->d_name);
    local_b8.size_ = sVar7 + 1;
    local_80.ptr = ".";
    local_80.size_ = 2;
    local_b8.ptr = pdVar6->d_name;
    bVar2 = ArrayPtr<const_char>::operator==(&local_b8,(ArrayPtr<const_char> *)&local_80);
    __dirp = local_88;
    if (!bVar2) {
      local_40.ptr = "..";
      local_40.size_ = 3;
      bVar2 = ArrayPtr<const_char>::operator==(&local_b8,&local_40);
      __dirp = local_88;
      if (!bVar2) {
        local_50.content.ptr = ".kj-tmp.";
        local_50.content.size_ = 9;
        bVar2 = StringPtr::startsWith((StringPtr *)&local_b8,&local_50);
        __dirp = local_88;
        if (!bVar2) {
          if (pdVar6->d_type == '\0') {
            value_00.content.size_ = (size_t)pAVar8;
            value_00.content.ptr = (char *)local_b8.size_;
            heapString((String *)&local_80,(kj *)local_b8.ptr,value_00);
            Vector<kj::String>::add<kj::String>((Vector<kj::String> *)&local_a8,(String *)&local_80)
            ;
          }
          else {
            value.content.size_ = (size_t)pAVar8;
            value.content.ptr = (char *)local_b8.size_;
            heapString((String *)&local_80,(kj *)local_b8.ptr,value);
            Vector<kj::String>::add<kj::String>((Vector<kj::String> *)&local_a8,(String *)&local_80)
            ;
          }
          Array<char>::~Array(&local_80);
          __dirp = local_88;
        }
      }
    }
  }
  if (*piVar5 != 0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,699,*piVar5,"readdir","");
    kj::_::Debug::Fault::fatal((Fault *)&local_80);
  }
  Vector<kj::String>::releaseAsArray(local_68,(Vector<kj::String> *)&local_a8);
  std::__sort<kj::String*,__gnu_cxx::__ops::_Iter_less_iter>
            (pAVar1->ptr,pAVar1->ptr + pAVar1->size_);
  ArrayBuilder<kj::String>::dispose(&local_a8);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++:687:5)>
  ::~Deferred(&local_60);
  return pAVar1;
}

Assistant:

Array<String> listNames() const {
    return list(false, [](StringPtr name, FsNode::Type type) { return heapString(name); });
  }